

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_UInt32 FT_Stream_GetULongLE(FT_Stream stream)

{
  byte *pbVar1;
  uint local_1c;
  byte *pbStack_18;
  FT_UInt32 result;
  FT_Byte *p;
  FT_Stream stream_local;
  
  local_1c = 0;
  pbVar1 = stream->cursor;
  pbStack_18 = pbVar1;
  if (pbVar1 + 3 < stream->limit) {
    pbStack_18 = pbVar1 + 4;
    local_1c = (uint)pbVar1[3] << 0x18 | (uint)pbVar1[2] << 0x10 | (uint)pbVar1[1] << 8 |
               (uint)*pbVar1;
  }
  stream->cursor = pbStack_18;
  return local_1c;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Stream_GetULongLE( FT_Stream  stream )
  {
    FT_Byte*  p;
    FT_UInt32 result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 3 < stream->limit )
      result       = FT_NEXT_ULONG_LE( p );
    stream->cursor = p;
    return result;
  }